

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

upb_DecodeStatus
upb_DecodeLengthPrefixed
          (char *buf,size_t size,upb_Message *msg,size_t *num_bytes_read,upb_MiniTable *mt,
          upb_ExtensionRegistry *extreg,int options,upb_Arena *arena)

{
  char cVar1;
  upb_DecodeStatus uVar2;
  uint64_t b;
  size_t i;
  uint64_t msg_len;
  upb_ExtensionRegistry *extreg_local;
  upb_MiniTable *mt_local;
  size_t *num_bytes_read_local;
  upb_Message *msg_local;
  size_t size_local;
  char *buf_local;
  
  i = 0;
  b = 0;
  size_local = (size_t)buf;
  while( true ) {
    if ((size <= b) || (9 < b)) {
      return kUpb_DecodeStatus_Malformed;
    }
    cVar1 = *(char *)size_local;
    size_local = size_local + 1;
    i = (((long)cVar1 & 0x7fU) << ((char)b * '\a' & 0x3fU)) + i;
    if (((long)cVar1 & 0x80U) == 0) break;
    b = b + 1;
  }
  *num_bytes_read = b + 1 + i;
  if (size < *num_bytes_read) {
    return kUpb_DecodeStatus_Malformed;
  }
  if (0x7fffffff < i) {
    return kUpb_DecodeStatus_Malformed;
  }
  uVar2 = upb_Decode((char *)size_local,i,msg,mt,extreg,options,arena);
  return uVar2;
}

Assistant:

upb_DecodeStatus upb_DecodeLengthPrefixed(const char* buf, size_t size,
                                          upb_Message* msg,
                                          size_t* num_bytes_read,
                                          const upb_MiniTable* mt,
                                          const upb_ExtensionRegistry* extreg,
                                          int options, upb_Arena* arena) {
  // To avoid needing to make a Decoder just to decode the initial length,
  // hand-decode the leading varint for the message length here.
  uint64_t msg_len = 0;
  for (size_t i = 0;; ++i) {
    if (i >= size || i > 9) {
      return kUpb_DecodeStatus_Malformed;
    }
    uint64_t b = *buf;
    buf++;
    msg_len += (b & 0x7f) << (i * 7);
    if ((b & 0x80) == 0) {
      *num_bytes_read = i + 1 + msg_len;
      break;
    }
  }

  // If the total number of bytes we would read (= the bytes from the varint
  // plus however many bytes that varint says we should read) is larger then the
  // input buffer then error as malformed.
  if (*num_bytes_read > size) {
    return kUpb_DecodeStatus_Malformed;
  }
  if (msg_len > INT32_MAX) {
    return kUpb_DecodeStatus_Malformed;
  }

  return upb_Decode(buf, msg_len, msg, mt, extreg, options, arena);
}